

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValuePair.h
# Opt level: O2

void __thiscall
JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::KeyValuePair
          (KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *this,
          KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *other)

{
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->key,(other->key).ptr);
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->value,(other->value).ptr);
  return;
}

Assistant:

KeyValuePair(const KeyValuePair& other)
            : key(other.key), value(other.value)
        {}